

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  int _d;
  int iVar1;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  uint uVar15;
  void *pvVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  size_t sVar25;
  uint uVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  iVar12 = (this->super_Cast).type_from;
  iVar13 = (this->super_Cast).type_to;
  if (iVar12 == iVar13) {
    iVar12 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar12 = bottom_blob->w;
      iVar13 = bottom_blob->h;
      iVar21 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar12;
      top_blob->h = iVar13;
      top_blob->d = iVar21;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar12 = 0;
    }
  }
  else {
    iVar21 = bottom_blob->w;
    _h = bottom_blob->h;
    _d = bottom_blob->d;
    uVar15 = bottom_blob->c;
    iVar1 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar25 = (size_t)_elempack;
    switch(iVar13) {
    case 1:
      if (iVar12 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar25 = sVar25 * 4;
      break;
    case 2:
    case 4:
      sVar25 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar25 = bottom_blob->elemsize;
    }
    switch(iVar1) {
    case 1:
      Mat::create(top_blob,iVar21,sVar25,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar21,_h,sVar25,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar21,_h,uVar15,sVar25,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar21,_h,_d,uVar15,sVar25,_elempack,opt->blob_allocator);
    }
    iVar12 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (((this->super_Cast).type_from == 1) && ((this->super_Cast).type_to == 2)) {
        iVar12 = cpu_support_x86_f16c();
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar17 = 0;
            do {
              if (0 < iVar13) {
                sVar25 = top_blob->cstep;
                sVar3 = bottom_blob->cstep;
                sVar4 = top_blob->elemsize;
                pvVar14 = top_blob->data;
                sVar5 = bottom_blob->elemsize;
                pvVar16 = bottom_blob->data;
                lVar23 = 0;
                do {
                  uVar11 = float32_to_float16(*(float *)((long)pvVar16 +
                                                        lVar23 * 4 + sVar3 * sVar5 * lVar17));
                  *(unsigned_short *)((long)pvVar14 + lVar23 * 2 + sVar25 * sVar4 * lVar17) = uVar11
                  ;
                  lVar23 = lVar23 + 1;
                } while (iVar13 != (int)lVar23);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != iVar12);
          }
        }
        else {
          cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      auVar28 = in_ZMM3._0_16_;
      if (((this->super_Cast).type_from == 2) && ((this->super_Cast).type_to == 1)) {
        iVar12 = cpu_support_x86_f16c();
        auVar28 = in_ZMM3._0_16_;
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar17 = 0;
            do {
              if (0 < iVar13) {
                sVar25 = top_blob->cstep;
                sVar3 = bottom_blob->cstep;
                sVar4 = top_blob->elemsize;
                pvVar14 = top_blob->data;
                sVar5 = bottom_blob->elemsize;
                pvVar16 = bottom_blob->data;
                lVar23 = 0;
                do {
                  fVar27 = float16_to_float32(*(unsigned_short *)
                                               ((long)pvVar16 + lVar23 * 2 + sVar3 * sVar5 * lVar17)
                                             );
                  *(float *)((long)pvVar14 + lVar23 * 4 + sVar25 * sVar4 * lVar17) = fVar27;
                  lVar23 = lVar23 + 1;
                } while (iVar13 != (int)lVar23);
              }
              auVar28 = in_ZMM3._0_16_;
              lVar17 = lVar17 + 1;
            } while (lVar17 != iVar12);
          }
        }
        else {
          cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      if (0 < (int)uVar15 && ((this->super_Cast).type_to == 1 && (this->super_Cast).type_from == 3))
      {
        uVar26 = _d * _elempack * _h * iVar21;
        pvVar14 = bottom_blob->data;
        sVar25 = bottom_blob->cstep;
        pvVar16 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar19 = 0;
        do {
          if (0 < (int)uVar26) {
            uVar22 = 0;
            do {
              *(float *)((long)pvVar16 + uVar22 * 4) = (float)(int)*(char *)((long)pvVar14 + uVar22)
              ;
              uVar22 = uVar22 + 1;
            } while (uVar26 != uVar22);
          }
          uVar19 = uVar19 + 1;
          pvVar16 = (void *)((long)pvVar16 + sVar3 * sVar4);
          pvVar14 = (void *)((long)pvVar14 + sVar25 * sVar5);
        } while (uVar19 != uVar15);
      }
      if (((this->super_Cast).type_from == 1) && ((this->super_Cast).type_to == 4)) {
        iVar12 = cpu_support_x86_avx2();
        auVar10 = _DAT_005f18e0;
        auVar9 = _DAT_005f18c0;
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            uVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar17 = 0;
            auVar29._8_8_ = 0x8000000000000000;
            auVar29._0_8_ = 0x8000000000000000;
            auVar28 = vpcmpeqd_avx(auVar28,auVar28);
            do {
              pauVar18 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar17 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar20 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar17 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar15 < 0x10) {
                uVar26 = 0;
              }
              else {
                iVar13 = 0xf;
                do {
                  auVar30 = vpsrld_avx(*pauVar18,0x10);
                  auVar31 = vpsrld_avx(pauVar18[1],0x10);
                  auVar30 = vpackusdw_avx(auVar30,auVar31);
                  auVar31 = vpsrld_avx(pauVar18[2],0x10);
                  auVar32 = vpsrld_avx(pauVar18[3],0x10);
                  auVar31 = vpackusdw_avx(auVar31,auVar32);
                  pauVar20[1] = auVar31;
                  *pauVar20 = auVar30;
                  pauVar18 = pauVar18 + 4;
                  pauVar20 = pauVar20 + 2;
                  iVar13 = iVar13 + 0x10;
                  uVar26 = uVar15 & 0xfffffff0;
                } while (iVar13 < (int)uVar15);
              }
              uVar24 = uVar26 | 7;
              while ((int)uVar24 < (int)uVar15) {
                auVar30 = vpsrld_avx(*pauVar18,0x10);
                auVar31 = vpsrld_avx(pauVar18[1],0x10);
                auVar30 = vpackusdw_avx(auVar30,auVar31);
                *pauVar20 = auVar30;
                pauVar18 = pauVar18 + 2;
                pauVar20 = pauVar20 + 1;
                uVar24 = uVar26 + 0xf;
                uVar26 = uVar26 + 8;
              }
              if ((int)uVar26 < (int)uVar15) {
                uVar19 = CONCAT44(0,~uVar26 + uVar15);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = uVar19;
                auVar32 = vpshufd_avx(auVar30,0x44);
                auVar30 = vorps_avx(auVar32,auVar29);
                auVar31 = vorps_avx(auVar32,auVar29);
                auVar32 = vorps_avx(auVar32,auVar29);
                uVar22 = 0;
                do {
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = uVar22;
                  auVar33 = vpshufd_avx(auVar33,0x44);
                  auVar35._16_16_ = auVar33;
                  auVar35._0_16_ = auVar33;
                  auVar6 = vorps_avx(auVar35,auVar9);
                  auVar35 = vorps_avx(auVar35,auVar10);
                  auVar34._0_8_ = auVar35._16_8_ ^ 0x8000000000000000;
                  auVar34._8_4_ = auVar35._24_4_;
                  auVar34._12_4_ = auVar35._28_4_ ^ 0x80000000;
                  auVar7 = vpcmpgtq_avx(auVar34,auVar30);
                  uVar8 = auVar35._0_8_;
                  auVar37._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar36._8_4_ = auVar35._8_4_;
                  auVar37._8_4_ = auVar36._8_4_;
                  uVar26 = auVar35._12_4_;
                  auVar37._12_4_ = uVar26 ^ 0x80000000;
                  auVar33 = vpcmpgtq_avx(auVar37,auVar31);
                  auVar33 = vpackssdw_avx(auVar33,auVar7);
                  auVar39._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
                  auVar39._8_4_ = auVar6._24_4_;
                  auVar39._12_4_ = auVar6._28_4_ ^ 0x80000000;
                  auVar37 = vpcmpgtq_avx(auVar39,auVar30);
                  auVar42._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar41._8_4_ = auVar6._8_4_;
                  auVar42._8_4_ = auVar41._8_4_;
                  auVar42._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar34 = vpcmpgtq_avx(auVar42,auVar32);
                  auVar34 = vpackssdw_avx(auVar34,auVar37);
                  auVar33 = vpackssdw_avx(auVar34 ^ auVar28,auVar33 ^ auVar28);
                  auVar34 = vpmovsxwd_avx(auVar33);
                  auVar39 = vpunpckhwd_avx(auVar33,auVar33);
                  auVar38._16_16_ = auVar39;
                  auVar38._0_16_ = auVar34;
                  auVar35 = vmaskmovps_avx(auVar38,*(undefined1 (*) [32])(*pauVar18 + uVar22 * 4));
                  if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2) = auVar35._2_2_;
                  }
                  auVar41._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar41._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar33 = vpcmpgtq_avx(auVar41,auVar32);
                  auVar33 = vpackssdw_avx(auVar33,auVar33);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 2) = auVar35._6_2_;
                  }
                  auVar33 = vpackssdw_avx(auVar37,auVar37);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 4) = auVar35._10_2_;
                  }
                  auVar33 = vpackssdw_avx(auVar37,auVar37);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 6) = auVar35._14_2_;
                  }
                  auVar40._8_4_ = auVar36._8_4_;
                  auVar40._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar40._12_4_ = uVar26 ^ 0x80000000;
                  auVar33 = vpcmpgtq_avx(auVar40,auVar31);
                  auVar33 = vpackssdw_avx(auVar33,auVar33);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 8) = auVar35._18_2_;
                  }
                  auVar36._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar36._12_4_ = uVar26 ^ 0x80000000;
                  auVar33 = vpcmpgtq_avx(auVar36,auVar31);
                  auVar33 = vpackssdw_avx(auVar33,auVar33);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 10) = auVar35._22_2_;
                  }
                  auVar33 = vpackssdw_avx(auVar7,auVar7);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 0xc) = auVar35._26_2_;
                  }
                  auVar33 = vpackssdw_avx(auVar7,auVar7);
                  auVar33 = vpackssdw_avx(auVar33 ^ auVar28,auVar33 ^ auVar28);
                  if ((auVar33 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar20 + uVar22 * 2 + 0xe) = auVar35._30_2_;
                  }
                  uVar22 = uVar22 + 8;
                } while ((uVar19 + 8 & 0xfffffffffffffff8) != uVar22);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != iVar12);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar12 = 0;
      if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
        iVar13 = cpu_support_x86_avx2();
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            uVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar17 = 0;
            auVar28 = ZEXT816(0) << 0x40;
            iVar12 = 0;
            do {
              pauVar18 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar17 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar20 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar17 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar15 < 8) {
                uVar26 = 0;
              }
              else {
                iVar21 = 7;
                do {
                  auVar30 = vpunpcklwd_avx(auVar28,*pauVar18);
                  auVar29 = vpunpckhwd_avx(auVar28,*pauVar18);
                  pauVar20[1] = auVar29;
                  *pauVar20 = auVar30;
                  pauVar18 = pauVar18 + 1;
                  pauVar20 = pauVar20 + 2;
                  iVar21 = iVar21 + 8;
                  uVar26 = uVar15 & 0xfffffff8;
                } while (iVar21 < (int)uVar15);
              }
              uVar24 = uVar26 | 3;
              while ((int)uVar24 < (int)uVar15) {
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)*pauVar18;
                auVar29 = vpunpcklwd_avx(auVar28,auVar31);
                *pauVar20 = auVar29;
                pauVar18 = (undefined1 (*) [16])(*pauVar18 + 8);
                pauVar20 = pauVar20 + 1;
                uVar24 = uVar26 + 7;
                uVar26 = uVar26 + 4;
              }
              if (uVar15 - uVar26 != 0 && (int)uVar26 <= (int)uVar15) {
                lVar23 = 0;
                do {
                  *(uint *)(*pauVar20 + lVar23 * 4) =
                       (uint)*(ushort *)(*pauVar18 + lVar23 * 2) << 0x10;
                  lVar23 = lVar23 + 1;
                } while (uVar15 - uVar26 != (int)lVar23);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != iVar13);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}